

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void colmajor_to_rowmajor<double,int>
               (double *Xc,int *Xc_ind,int *Xc_indptr,size_t nrows,size_t ncols,
               vector<double,_std::allocator<double>_> *Xr,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *Xr_ind,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *Xr_indptr)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  pointer puVar5;
  undefined1 auVar6 [16];
  unsigned_long *__buffer;
  int iVar7;
  unsigned_long uVar8;
  size_t sVar9;
  ulong uVar10;
  size_type sVar11;
  long lVar12;
  unsigned_long uVar13;
  size_type __n;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  pair<unsigned_long_*,_long> pVar17;
  vector<unsigned_long,_std::allocator<unsigned_long>_> row_indices;
  allocator_type local_71;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  iVar2 = Xc_indptr[ncols];
  __n = (size_type)iVar2;
  local_50 = Xr;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,__n,(allocator_type *)&local_70);
  if (ncols != 0) {
    sVar9 = 0;
    iVar7 = *Xc_indptr;
    do {
      iVar3 = Xc_indptr[sVar9 + 1];
      if (iVar7 < iVar3) {
        lVar12 = (long)iVar7;
        do {
          local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12] = (long)Xc_ind[lVar12];
          lVar12 = lVar12 + 1;
        } while (iVar3 != lVar12);
      }
      sVar9 = sVar9 + 1;
      iVar7 = iVar3;
    } while (sVar9 != ncols);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_70,__n,&local_71);
  puVar5 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar6 = _DAT_0036e1f0;
  if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_58._M_current =
         local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar1 = ((long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start) - 8;
    auVar16._8_4_ = (int)uVar1;
    auVar16._0_8_ = uVar1;
    auVar16._12_4_ = (int)(uVar1 >> 0x20);
    auVar14._0_8_ = uVar1 >> 3;
    auVar14._8_8_ = auVar16._8_8_ >> 3;
    uVar10 = 0;
    auVar14 = auVar14 ^ _DAT_0036e1f0;
    auVar15 = _DAT_0036e1e0;
    do {
      auVar16 = auVar15 ^ auVar6;
      if ((bool)(~(auVar16._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar16._0_4_ ||
                  auVar14._4_4_ < auVar16._4_4_) & 1)) {
        local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10] = uVar10;
      }
      if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
          auVar16._12_4_ <= auVar14._12_4_) {
        local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10 + 1] = uVar10 + 1;
      }
      uVar10 = uVar10 + 2;
      lVar12 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar12 + 2;
    } while (((uVar1 >> 3) + 2 & 0xfffffffffffffffe) != uVar10);
    lVar12 = (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    pVar17 = std::get_temporary_buffer<unsigned_long>((lVar12 - (lVar12 + 1 >> 0x3f)) + 1 >> 1);
    lVar12 = pVar17.second;
    __buffer = pVar17.first;
    if (__buffer == (unsigned_long *)0x0) {
      lVar12 = 0;
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<colmajor_to_rowmajor<double,int>(double_const*,int_const*,int_const*,unsigned_long,unsigned_long,std::vector<double,std::allocator<double>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )puVar5,local_58,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_utils_hpp:3655:22)>
                  )&local_48);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<colmajor_to_rowmajor<double,int>(double_const*,int_const*,int_const*,unsigned_long,unsigned_long,std::vector<double,std::allocator<double>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )puVar5,local_58,__buffer,lVar12,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_utils_hpp:3655:22)>
                  )&local_48);
    }
    operator_delete(__buffer,lVar12 << 3);
  }
  std::vector<double,_std::allocator<double>_>::resize(local_50,__n);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(Xr_ind,__n);
  if (iVar2 != 0) {
    pdVar4 = (local_50->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (Xr_ind->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar11 = 0;
    do {
      uVar8 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[sVar11];
      pdVar4[sVar11] = Xc[uVar8];
      puVar5[sVar11] = (long)Xc_ind[uVar8];
      sVar11 = sVar11 + 1;
    } while (__n != sVar11);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(Xr_indptr,nrows + 1);
  if (iVar2 != 0) {
    puVar5 = (Xr_indptr->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar11 = 0;
    uVar13 = 0;
    uVar8 = 0;
    do {
      if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start
          [local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[sVar11]] == uVar8) {
        uVar13 = uVar13 + 1;
      }
      else {
        puVar5[uVar8 + 1] = uVar13;
        uVar8 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start
                [local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar11]];
        uVar13 = 0;
      }
      sVar11 = sVar11 + 1;
    } while (__n != sVar11);
  }
  if (1 < nrows) {
    puVar5 = (Xr_indptr->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = puVar5[1];
    lVar12 = 0;
    do {
      uVar8 = uVar8 + puVar5[lVar12 + 2];
      puVar5[lVar12 + 2] = uVar8;
      lVar12 = lVar12 + 1;
    } while (nrows - 1 != lVar12);
  }
  if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void colmajor_to_rowmajor(const real_t *restrict Xc, const sparse_ix *restrict Xc_ind, const sparse_ix *restrict Xc_indptr,
                          size_t nrows, size_t ncols,
                          std::vector<double> &Xr, std::vector<size_t> &Xr_ind, std::vector<size_t> &Xr_indptr)
{
    /* First convert to COO */
    size_t nnz = Xc_indptr[ncols];
    std::vector<size_t> row_indices(nnz);
    for (size_t col = 0; col < ncols; col++)
    {
        for (sparse_ix ix = Xc_indptr[col]; ix < Xc_indptr[col+1]; ix++)
        {
            row_indices[ix] = Xc_ind[ix];
        }
    }

    /* Then copy the data argsorted by rows */
    std::vector<size_t> argsorted_indices(nnz);
    std::iota(argsorted_indices.begin(), argsorted_indices.end(), (size_t)0);
    std::stable_sort(argsorted_indices.begin(), argsorted_indices.end(),
                     [&row_indices](const size_t a, const size_t b)
                     {return row_indices[a] < row_indices[b];});
    Xr.resize(nnz);
    Xr_ind.resize(nnz);
    for (size_t ix = 0; ix < nnz; ix++)
    {
        Xr[ix] = Xc[argsorted_indices[ix]];
        Xr_ind[ix] = Xc_ind[argsorted_indices[ix]];
    }

    /* Now build the index pointer */
    Xr_indptr.resize(nrows+1);
    size_t curr_row = 0;
    size_t curr_n = 0;
    for (size_t ix = 0; ix < nnz; ix++)
    {
        if (row_indices[argsorted_indices[ix]] != curr_row)
        {
            Xr_indptr[curr_row+1] = curr_n;
            curr_n = 0;
            curr_row = row_indices[argsorted_indices[ix]];
        }

        else
        {
            curr_n++;
        }
    }
    for (size_t row = 1; row < nrows; row++)
        Xr_indptr[row+1] += Xr_indptr[row];
}